

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

PDFObject * __thiscall PDFObjectParser::ParseArray(PDFObjectParser *this)

{
  bool bVar1;
  EStatusCode EVar2;
  PDFObject *pPVar3;
  Trace *pTVar4;
  undefined8 uVar5;
  string local_b0 [32];
  string local_90 [32];
  undefined1 local_70 [8];
  RefCountPtr<PDFObject> anObject;
  int local_4c;
  undefined1 local_48 [4];
  EStatusCode status;
  string token;
  bool arrayEndEncountered;
  PDFArray *anArray;
  PDFObjectParser *this_local;
  
  token.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_48);
  local_4c = 0;
  EVar2 = IncreaseAndCheckDepth(this);
  if (EVar2 == eSuccess) {
    this_local = (PDFObjectParser *)operator_new(0x60);
    PDFArray::PDFArray((PDFArray *)this_local);
    while ((bVar1 = GetNextToken(this,(string *)local_48), bVar1 && local_4c == 0 &&
           (token.field_2._M_local_buf[0xf] =
                 std::operator==(&scRightSquare_abi_cxx11_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_48), !(bool)token.field_2._M_local_buf[0xf]))) {
      ReturnTokenToBuffer(this,(string *)local_48);
      pPVar3 = ParseNewObject(this);
      RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_70,pPVar3);
      bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_70);
      if (bVar1) {
        local_4c = -1;
        pTVar4 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_48);
        uVar5 = std::__cxx11::string::c_str();
        Trace::TraceToLog(pTVar4,
                          "PDFObjectParser::ParseArray, failure to parse array, failed to parse a member object. token = %s"
                          ,uVar5);
        std::__cxx11::string::~string(local_90);
      }
      else {
        pPVar3 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_70);
        PDFArray::AppendObject((PDFArray *)this_local,pPVar3);
      }
      RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_70);
    }
    EVar2 = DecreaseAndCheckDepth(this);
    if (EVar2 != eSuccess) {
      local_4c = -1;
    }
    if (((token.field_2._M_local_buf[0xf] & 1U) == 0) || (local_4c != 0)) {
      if (this_local != (PDFObjectParser *)0x0) {
        (*(((PDFObject *)&this_local->mTokenizer)->super_RefCountObject)._vptr_RefCountObject[1])();
      }
      pTVar4 = Trace::DefaultTrace();
      std::__cxx11::string::substr((ulong)local_b0,(ulong)local_48);
      uVar5 = std::__cxx11::string::c_str();
      Trace::TraceToLog(pTVar4,
                        "PDFObjectParser::ParseArray, failure to parse array, didn\'t find end of array or failure to parse array member object. token = %s"
                        ,uVar5);
      std::__cxx11::string::~string(local_b0);
      this_local = (PDFObjectParser *)0x0;
    }
  }
  else {
    this_local = (PDFObjectParser *)0x0;
  }
  anObject.mValue._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (PDFObject *)this_local;
}

Assistant:

PDFObject* PDFObjectParser::ParseArray()
{
	PDFArray* anArray;
	bool arrayEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	anArray = new PDFArray();

	// easy one. just loop till you get to a closing bracket token and recurse
	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		arrayEndEncountered = (scRightSquare == token);
		if(arrayEndEncountered)
			break;

		ReturnTokenToBuffer(token);
		RefCountPtr<PDFObject> anObject(ParseNewObject());
		if(!anObject)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseArray, failure to parse array, failed to parse a member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		}
		else
		{
			anArray->AppendObject(anObject.GetPtr());
		}
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;

	if(arrayEndEncountered && PDFHummus::eSuccess == status)
	{
		return anArray;
	}
	else
	{
		delete anArray;
		TRACE_LOG1("PDFObjectParser::ParseArray, failure to parse array, didn't find end of array or failure to parse array member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}